

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_t * matd_crossproduct(matd_t *a,matd_t *b)

{
  matd_t mVar1;
  matd_t mVar2;
  matd_t mVar3;
  matd_t mVar4;
  matd_t mVar5;
  matd_t mVar6;
  uint cols;
  matd_t *pmVar7;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x3a9,"matd_t *matd_crossproduct(const matd_t *, const matd_t *)");
  }
  if (b == (matd_t *)0x0) {
    __assert_fail("b != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x3aa,"matd_t *matd_crossproduct(const matd_t *, const matd_t *)");
  }
  cols = a->ncols;
  if (cols == 3) {
    if (a->nrows != 1) goto LAB_003fc648;
  }
  else if ((cols != 1) || (a->nrows != 3)) goto LAB_003fc648;
  if (b->ncols == 3) {
    if (b->nrows == 1) {
LAB_003fc5dd:
      pmVar7 = matd_create(a->nrows,cols);
      mVar1 = b[2];
      mVar2 = b[3];
      mVar3 = a[2];
      mVar4 = a[3];
      pmVar7[1] = (matd_t)((double)mVar3 * (double)mVar2 - (double)mVar1 * (double)mVar4);
      mVar5 = b[1];
      mVar6 = a[1];
      pmVar7[2] = (matd_t)((double)mVar4 * (double)mVar5 - (double)mVar2 * (double)mVar6);
      pmVar7[3] = (matd_t)((double)mVar6 * (double)mVar1 - (double)mVar5 * (double)mVar3);
      return pmVar7;
    }
  }
  else if ((b->ncols == 1) && (b->nrows == 3)) goto LAB_003fc5dd;
LAB_003fc648:
  __assert_fail("matd_is_vector_len(a, 3) && matd_is_vector_len(b, 3)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x3ab,"matd_t *matd_crossproduct(const matd_t *, const matd_t *)");
}

Assistant:

matd_t *matd_crossproduct(const matd_t *a, const matd_t *b)
{ // only defined for vecs (col or row) of length 3
    assert(a != NULL);
    assert(b != NULL);
    assert(matd_is_vector_len(a, 3) && matd_is_vector_len(b, 3));

    matd_t * r = matd_create(a->nrows, a->ncols);

    r->data[0] = a->data[1] * b->data[2] - a->data[2] * b->data[1];
    r->data[1] = a->data[2] * b->data[0] - a->data[0] * b->data[2];
    r->data[2] = a->data[0] * b->data[1] - a->data[1] * b->data[0];

    return r;
}